

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_def.c
# Opt level: O3

char * upb_FileDef_EditionName(int edition)

{
  if (edition - 0x3e6U < 3) {
    return &DAT_0039d33c + *(int *)(&DAT_0039d33c + (ulong)(edition - 0x3e6U) * 4);
  }
  return "UNKNOWN";
}

Assistant:

UPB_API const char* upb_FileDef_EditionName(int edition) {
  // TODO Synchronize this with descriptor.proto better.
  switch (edition) {
    case UPB_DESC(EDITION_PROTO2):
      return "PROTO2";
    case UPB_DESC(EDITION_PROTO3):
      return "PROTO3";
    case UPB_DESC(EDITION_2023):
      return "2023";
    default:
      return "UNKNOWN";
  }
}